

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

Iterator __thiscall ODDLParser::Value::Iterator::operator++(Iterator *this,int param_1)

{
  Value *pVVar1;
  Value *extraout_RDX;
  Value *extraout_RDX_00;
  undefined4 in_register_00000034;
  long lVar2;
  Iterator IVar3;
  int param_1_local;
  Iterator *this_local;
  Iterator *inst;
  
  lVar2 = CONCAT44(in_register_00000034,param_1);
  if (*(long *)(lVar2 + 8) == 0) {
    Iterator(this,(Iterator *)ODDLParser::end);
    pVVar1 = extraout_RDX;
  }
  else {
    pVVar1 = Value::getNext(*(Value **)(lVar2 + 8));
    *(Value **)(lVar2 + 8) = pVVar1;
    Iterator(this,*(Value **)(lVar2 + 8));
    pVVar1 = extraout_RDX_00;
  }
  IVar3.m_current = pVVar1;
  IVar3.m_start = (Value *)this;
  return IVar3;
}

Assistant:

const Value::Iterator Value::Iterator::operator++( int ) {
    if( ddl_nullptr == m_current ) {
        return end;
    }

    m_current = m_current->getNext();
    Iterator inst( m_current );

    return inst;
}